

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_stone_skin(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (!bVar1) {
    bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_diamondskin);
    if (!bVar1) {
      bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_ironskin);
      if (!bVar1) {
        init_affect(&af);
        af.where = 0;
        af.aftype = get_spell_aftype(ch);
        af.type = (short)sn;
        af.level = (short)level;
        af.duration = (short)(level / 3);
        af.location = 0x11;
        af.modifier = (short)(level / 4);
        affect_to_char((CHAR_DATA *)vo,&af);
        act("$n\'s skin turns to stone.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
        send_to_char("Your skin turns to stone.\n\r",(CHAR_DATA *)vo);
        return;
      }
    }
  }
  if ((CHAR_DATA *)vo != ch) {
    act("$N\'s skin is already magically hardened.",ch,(void *)0x0,vo,3);
    return;
  }
  send_to_char("Your skin is already magically hardened.\n\r",ch);
  return;
}

Assistant:

void spell_stone_skin(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn) || is_affected(victim, gsn_diamondskin) || is_affected(victim, gsn_ironskin))
	{
		if (victim == ch)
			send_to_char("Your skin is already magically hardened.\n\r", ch);
		else
			act("$N's skin is already magically hardened.", ch, nullptr, victim, TO_CHAR);

		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level / 3;
	af.location = APPLY_AC;
	af.modifier = level / 4;
	affect_to_char(victim, &af);

	act("$n's skin turns to stone.", victim, nullptr, nullptr, TO_ROOM);
	send_to_char("Your skin turns to stone.\n\r", victim);
}